

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O0

void __thiscall
NshHistoryEntryCount_SuccessWhenFull_Test::~NshHistoryEntryCount_SuccessWhenFull_Test
          (NshHistoryEntryCount_SuccessWhenFull_Test *this)

{
  NshHistoryEntryCount_SuccessWhenFull_Test *this_local;
  
  ~NshHistoryEntryCount_SuccessWhenFull_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshHistoryEntryCount, SuccessWhenFull)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    for (unsigned int i = 0; i < NSH_CMD_HISTORY_SIZE; i++) {
        nsh_history_add_entry(&hist, new_entry);
    }

    ASSERT_EQ(nsh_history_entry_count(&hist), NSH_CMD_HISTORY_SIZE);
}